

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# writer.h
# Opt level: O0

ssize_t Fixpp::details::FieldWriter<Fixpp::Field<Fixpp::TagT<226U,_Fixpp::Type::Int>_>_>::write
                  (int __fd,void *__buf,size_t __n)

{
  long lVar1;
  Type *pTVar2;
  ostream *poVar3;
  undefined4 in_register_0000003c;
  Type value;
  Field<Fixpp::TagT<226U,_Fixpp::Type::Int>_> *field_local;
  ostream *os_local;
  
  pTVar2 = Field<Fixpp::TagT<226U,_Fixpp::Type::Int>_>::get
                     ((Field<Fixpp::TagT<226U,_Fixpp::Type::Int>_> *)__buf);
  lVar1 = *pTVar2;
  poVar3 = (ostream *)std::ostream::operator<<((void *)CONCAT44(in_register_0000003c,__fd),0xe2);
  poVar3 = std::operator<<(poVar3,"=");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,lVar1);
  std::operator<<(poVar3,'|');
  return (ssize_t)(void *)CONCAT44(in_register_0000003c,__fd);
}

Assistant:

static std::ostream& write(std::ostream& os, const Field& field)
        {
            auto value = field.get();
            os << Field::Tag::Id << "=" << value << SOH;
            return os;
        }